

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O0

myarima_object
search_arima(double *x,int N,int d,int D,int p_max,int q_max,int P_max,int Q_max,int Order_max,
            int stationary,int s,char *ic,int approximation,double *xreg,int r,double offset,
            int allowdrift,int allowmean,int verbose,int method)

{
  bool local_ef;
  bool local_ee;
  undefined8 uStack_e8;
  int trace;
  int bestseasonal [4];
  int bestorder [3];
  int seasonal [4];
  int local_ac;
  int iStack_a8;
  int order [3];
  myarima_object fit;
  myarima_object bestfit;
  double iapprox;
  double bestK;
  double best_ic;
  int K;
  int J;
  int I;
  int j;
  int i;
  int maxK;
  int imean;
  int idrift;
  double offset_local;
  int q_max_local;
  int p_max_local;
  int D_local;
  int d_local;
  int N_local;
  double *x_local;
  
  memset(&local_ac,0,0xc);
  memset(bestorder + 1,0,0x10);
  memset(bestseasonal + 3,0,0xc);
  memset(&stack0xffffffffffffff18,0,0x10);
  local_ee = allowmean != 0 && d + D == 0;
  local_ef = allowdrift != 0 && d + D == 1 || local_ee;
  bestK = 1.79769313486232e+308;
  for (I = 0; I <= p_max; I = I + 1) {
    for (J = 0; J <= q_max; J = J + 1) {
      for (K = 0; K <= P_max; K = K + 1) {
        for (best_ic._4_4_ = 0; best_ic._4_4_ <= Q_max; best_ic._4_4_ = best_ic._4_4_ + 1) {
          if (I + J + K + best_ic._4_4_ <= Order_max) {
            for (best_ic._0_4_ = 0; best_ic._0_4_ <= (int)(uint)local_ef;
                best_ic._0_4_ = best_ic._0_4_ + 1) {
              local_ac = I;
              order[0] = J;
              if ((s == 0) || (((K == 0 && (best_ic._4_4_ == 0)) && (D == 0)))) {
                seasonal[1] = 0;
                seasonal[0] = 0;
                bestorder[2] = 0;
                bestorder[1] = 0;
              }
              else {
                bestorder[1] = K;
                seasonal[0] = best_ic._4_4_;
                seasonal[1] = s;
                bestorder[2] = D;
              }
              iStack_a8 = d;
              order._4_8_ = myarima(x,N,&local_ac,bestorder + 1,best_ic._0_4_,ic,0,approximation,
                                    offset,xreg,r,(int *)0x0);
              if (verbose == 1) {
                printf("p: %d d: %d q: %d P: %d D: %d Q: %d Drift/Mean: %d ic: %g \n",
                       ((myarima_object)order._4_8_)->ic,
                       (ulong)(uint)((myarima_object)order._4_8_)->sarimax->p,(ulong)(uint)d,
                       (ulong)(uint)((myarima_object)order._4_8_)->sarimax->q,
                       (ulong)(uint)((myarima_object)order._4_8_)->sarimax->P,(ulong)(uint)D,
                       ((myarima_object)order._4_8_)->sarimax->Q,best_ic._0_4_);
              }
              if (*(double *)(order._4_8_ + 0x10) <= bestK &&
                  bestK != *(double *)(order._4_8_ + 0x10)) {
                bestK = *(double *)(order._4_8_ + 0x10);
                unique0x1000028c = CONCAT44(iStack_a8,local_ac);
                bestorder[0] = order[0];
                uStack_e8 = CONCAT44(bestorder[2],bestorder[1]);
                bestseasonal[1] = seasonal[1];
                bestseasonal[0] = seasonal[0];
                iapprox = (double)best_ic._0_4_;
              }
              myarima_free((myarima_object)order._4_8_);
            }
          }
        }
      }
    }
  }
  fit = myarima(x,N,bestseasonal + 3,(int *)&stack0xffffffffffffff18,(int)iapprox,ic,0,approximation
                ,offset,xreg,r,(int *)0x0);
  if (((approximation != 0) && (fit->ic == 1.79769313486232e+308)) && (!NAN(fit->ic))) {
    myarima_free(fit);
    fit = search_arima(x,N,d,D,p_max,q_max,P_max,Q_max,Order_max,stationary,s,ic,0,xreg,r,offset,
                       allowdrift,allowmean,verbose,method);
  }
  return fit;
}

Assistant:

myarima_object search_arima(double *x, int N,int d, int D, int p_max, int q_max, int P_max, int Q_max, int Order_max, int stationary,int s, const char *ic,
	int approximation, double *xreg, int r, double offset,int allowdrift, int allowmean,int verbose, int method) {

	int idrift, imean, maxK, i, j, I, J,K;
	double best_ic,bestK,iapprox;
	myarima_object bestfit;
	myarima_object fit;
	int order[3] = {0,0,0};
	int seasonal[4] = {0,0,0,0};
	int bestorder[3] = {0,0,0};
	int bestseasonal[4] = {0,0,0,0};
	int trace = 0;

	
	idrift = allowdrift && (d + D == 1);

	imean = allowmean && (d + D == 0);

	maxK = (idrift || imean);

	//serial implementation

	//printf("d %d D %d p_max %d q_max %d P_max %d Q_max %d maxK %d \n",d,D,p_max,q_max,P_max,Q_max,maxK);

	best_ic = DBL_MAX;

	for(i = 0; i <= p_max; ++i) {
		for(j = 0;j <= q_max;++j) {
			for(I = 0; I <= P_max;++I) {
				for(J = 0; J <= Q_max; ++J) {
					if (i+j+I+J <= Order_max) {
						for(K = 0; K <= maxK; ++K) {
							order[0] = i;
							order[1] = d;
							order[2] = j;
							
							// bug fix: still need to set PDQ or else carries over
							// prior PDQ parameters in seasonal which may be non 0 but then attempt
							// to optimize model with > 0 PDQ which can throw seg faults
							// for example in emle.fcssx when mutating phi which assumes s is > 0 if P+Q is > 0
							if (
								s == 0 ||
								(I == 0 && J == 0 && D == 0)
							) {
								seasonal[0] = seasonal[1] = seasonal[2] = seasonal[3] = 0;
							} else {
								seasonal[0] = I;
								seasonal[1] = D;
								seasonal[2] = J;
								seasonal[3] = s;
							}

							fit = myarima(x,N,order,seasonal, K, ic, trace, approximation, offset,xreg, r, NULL);
							if (verbose == 1) {
								printf("p: %d d: %d q: %d P: %d D: %d Q: %d Drift/Mean: %d ic: %g \n",fit->sarimax->p,d,fit->sarimax->q,fit->sarimax->P,D,fit->sarimax->Q,K,fit->ic);
							}
							
							//myarima_summary(fit);

							if (best_ic > fit->ic) {
								best_ic = fit->ic;
								memcpy(bestorder,order,sizeof(int)*3);
								memcpy(bestseasonal,seasonal,sizeof(int)*4);
								bestK = K;
							}

							myarima_free(fit);

						}
					}
				}
			}
		}
	}

	//printf("best_ic %g \n",best_ic);

	bestfit = myarima(x,N,bestorder,bestseasonal, bestK, ic, trace, approximation, offset,xreg, r, NULL);

	if (approximation) {
		if (bestfit->ic == DBL_MAX) {
			iapprox = 0;
			myarima_free(bestfit);

			bestfit = search_arima(x,N,d,D,p_max,q_max,P_max,Q_max,Order_max,stationary,s,ic,iapprox,xreg,r,offset,allowdrift,allowmean,verbose,method);

		}
	}


	return bestfit;
}